

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.hpp
# Opt level: O2

double * __thiscall openjij::graph::Sparse<double>::J(Sparse<double> *this,Index i,Index j)

{
  ulong uVar1;
  mapped_type *pmVar2;
  key_type local_10;
  
  uVar1 = (this->super_Graph)._num_spins;
  if (uVar1 <= i) {
    __assert_fail("i < get_num_spins()",
                  "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/include/openjij/graph/sparse.hpp"
                  ,0x120,
                  "const FloatType &openjij::graph::Sparse<double>::J(Index, Index) const [FloatType = double]"
                 );
  }
  if (uVar1 <= j) {
    __assert_fail("j < get_num_spins()",
                  "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/include/openjij/graph/sparse.hpp"
                  ,0x121,
                  "const FloatType &openjij::graph::Sparse<double>::J(Index, Index) const [FloatType = double]"
                 );
  }
  local_10.second = j;
  if (j < i) {
    local_10.second = i;
    i = j;
  }
  local_10.first = i;
  pmVar2 = std::__detail::
           _Map_base<std::pair<unsigned_long,_unsigned_long>,_std::pair<const_std::pair<unsigned_long,_unsigned_long>,_double>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_long,_unsigned_long>_>,_openjij::utility::PairHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::at((_Map_base<std::pair<unsigned_long,_unsigned_long>,_std::pair<const_std::pair<unsigned_long,_unsigned_long>,_double>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_long,_unsigned_long>_>,_openjij::utility::PairHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 *)&this->_J,&local_10);
  return pmVar2;
}

Assistant:

const FloatType &J(Index i, Index j) const {
    assert(i < get_num_spins());
    assert(j < get_num_spins());
    return _J.at(std::make_pair(std::min(i, j), std::max(i, j)));
  }